

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_cf_movec(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_ptr pTVar1;
  TCGv_i32 pTVar2;
  uint16_t uVar3;
  uint uVar4;
  uintptr_t o;
  TCGv_i32 *ppTVar5;
  TCGTemp *local_38;
  TCGv_i32 local_30;
  TCGv_i32 local_28;
  
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = read_im16(env,s);
  if ((short)uVar3 < 0) {
    uVar4 = uVar3 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar4 & 1) == 0) {
      ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar5 = s->writeback;
    }
  }
  else {
    ppTVar5 = tcg_ctx->cpu_dregs;
    uVar4 = (uint)(uVar3 >> 0xc);
  }
  pTVar1 = tcg_ctx->cpu_env;
  pTVar2 = ppTVar5[uVar4];
  local_30 = tcg_const_i32_m68k(tcg_ctx,uVar3 & 0xfff);
  local_30 = local_30 + (long)tcg_ctx;
  local_38 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  local_28 = pTVar2 + (long)tcg_ctx;
  tcg_gen_callN_m68k(tcg_ctx,helper_cf_movec_to_m68k,(TCGTemp *)0x0,3,&local_38);
  gen_exit_tb(s);
  return;
}

Assistant:

DISAS_INSN(cf_movec)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv reg;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    if (ext & 0x8000) {
        reg = AREG(ext, 12);
    } else {
        reg = DREG(ext, 12);
    }
    gen_helper_cf_movec_to(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, ext & 0xfff), reg);
    gen_exit_tb(s);
}